

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiID ImGui::DockSpaceOverViewport
                  (ImGuiViewport *viewport,ImGuiDockNodeFlags dockspace_flags,
                  ImGuiWindowClass *window_class)

{
  ImGuiContext *pIVar1;
  ImGuiID IVar2;
  ImGuiContext *g;
  ImVec2 IVar3;
  ImVec2 IVar4;
  char label [32];
  ImVec2 local_60;
  char local_58 [40];
  
  if (viewport == (ImGuiViewport *)0x0) {
    viewport = GetMainViewport();
  }
  pIVar1 = GImGui;
  IVar3.x = (viewport->WorkOffsetMin).x + (viewport->Pos).x;
  IVar3.y = (viewport->WorkOffsetMin).y + (viewport->Pos).y;
  (GImGui->NextWindowData).PosVal = IVar3;
  (pIVar1->NextWindowData).PosPivotVal.x = 0.0;
  (pIVar1->NextWindowData).PosPivotVal.y = 0.0;
  (pIVar1->NextWindowData).PosCond = 1;
  (pIVar1->NextWindowData).PosUndock = true;
  IVar4.x = (viewport->WorkOffsetMax).x + ((viewport->Size).x - (viewport->WorkOffsetMin).x);
  IVar4.y = (viewport->WorkOffsetMax).y + ((viewport->Size).y - (viewport->WorkOffsetMin).y);
  (pIVar1->NextWindowData).SizeVal = IVar4;
  (pIVar1->NextWindowData).SizeCond = 1;
  IVar2 = viewport->ID;
  (pIVar1->NextWindowData).Flags = (pIVar1->NextWindowData).Flags | 0x103;
  (pIVar1->NextWindowData).ViewportId = IVar2;
  ImFormatString(local_58,0x20,"DockSpaceViewport_%08X");
  PushStyleVar(2,0.0);
  PushStyleVar(3,0.0);
  local_60.x = 0.0;
  local_60.y = 0.0;
  PushStyleVar(1,&local_60);
  Begin(local_58,(bool *)0x0,(dockspace_flags & 8U) << 4 | 0x282027);
  PopStyleVar(3);
  IVar2 = ImGuiWindow::GetID(GImGui->CurrentWindow,"DockSpace",(char *)0x0);
  local_60.x = 0.0;
  local_60.y = 0.0;
  DockSpace(IVar2,&local_60,dockspace_flags,window_class);
  End();
  return IVar2;
}

Assistant:

ImGuiID ImGui::DockSpaceOverViewport(ImGuiViewport* viewport, ImGuiDockNodeFlags dockspace_flags, const ImGuiWindowClass* window_class)
{
    if (viewport == NULL)
        viewport = GetMainViewport();

    SetNextWindowPos(viewport->GetWorkPos());
    SetNextWindowSize(viewport->GetWorkSize());
    SetNextWindowViewport(viewport->ID);

    ImGuiWindowFlags host_window_flags = 0;
    host_window_flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoDocking;
    host_window_flags |= ImGuiWindowFlags_NoBringToFrontOnFocus | ImGuiWindowFlags_NoNavFocus;
    if (dockspace_flags & ImGuiDockNodeFlags_PassthruCentralNode)
        host_window_flags |= ImGuiWindowFlags_NoBackground;

    char label[32];
    ImFormatString(label, IM_ARRAYSIZE(label), "DockSpaceViewport_%08X", viewport->ID);

    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowBorderSize, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(0.0f, 0.0f));
    Begin(label, NULL, host_window_flags);
    PopStyleVar(3);

    ImGuiID dockspace_id = GetID("DockSpace");
    DockSpace(dockspace_id, ImVec2(0.0f, 0.0f), dockspace_flags, window_class);
    End();

    return dockspace_id;
}